

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_path.cpp
# Opt level: O0

void FILECanonicalizePath(LPSTR lpUnixPath)

{
  char *pcVar1;
  size_t sVar2;
  char *__dest;
  LPSTR slashptr;
  LPSTR slashdotptr;
  LPSTR dotdotptr;
  LPSTR slashslashptr;
  LPSTR lpUnixPath_local;
  
  dotdotptr = lpUnixPath;
  while (dotdotptr = strstr(dotdotptr,"//"), slashptr = lpUnixPath, dotdotptr != (char *)0x0) {
    if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
      abort();
    }
    sVar2 = strlen(dotdotptr + 1);
    memmove(dotdotptr,dotdotptr + 1,sVar2 + 1);
  }
  while (slashptr = strstr(slashptr,"/./"), slashptr != (char *)0x0) {
    if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
      abort();
    }
    sVar2 = strlen(slashptr + 2);
    memmove(slashptr,slashptr + 2,sVar2 + 1);
  }
LAB_0014446a:
  do {
    pcVar1 = strstr(lpUnixPath,"/../");
    if (pcVar1 == (char *)0x0) {
LAB_0014458f:
      pcVar1 = strstr(lpUnixPath,"/..");
      if (pcVar1 == lpUnixPath) {
        lpUnixPath[1] = '\0';
      }
      else if ((pcVar1 != (char *)0x0) && (pcVar1[3] == '\0')) {
        *pcVar1 = '\0';
        pcVar1 = strrchr(lpUnixPath,0x2f);
        if (pcVar1 != (char *)0x0) {
          if (pcVar1 == lpUnixPath) {
            lpUnixPath[1] = '\0';
          }
          else {
            *pcVar1 = '\0';
          }
        }
      }
      pcVar1 = strstr(lpUnixPath,"/.");
      if ((pcVar1 != (char *)0x0) && (pcVar1[2] == '\0')) {
        if (pcVar1 == lpUnixPath) {
          lpUnixPath[1] = '\0';
        }
        else {
          *pcVar1 = '\0';
        }
      }
      return;
    }
    if (pcVar1 != lpUnixPath) {
      *pcVar1 = '\0';
      __dest = strrchr(lpUnixPath,0x2f);
      if (__dest == (char *)0x0) {
        fprintf(_stderr,"] %s %s:%d","FILECanonicalizePath",
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/file/pal_path.cpp"
                ,0x404);
        fprintf(_stderr,"can\'t find leading \'/\' before \'/../ sequence\n");
        goto LAB_0014458f;
      }
      if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
        abort();
      }
      sVar2 = strlen(pcVar1 + 3);
      memmove(__dest,pcVar1 + 3,sVar2 + 1);
      goto LAB_0014446a;
    }
    if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
      abort();
    }
    sVar2 = strlen(lpUnixPath + 3);
    memmove(lpUnixPath,lpUnixPath + 3,sVar2 + 1);
  } while( true );
}

Assistant:

void FILECanonicalizePath(LPSTR lpUnixPath)
{
    LPSTR slashslashptr;
    LPSTR dotdotptr;
    LPSTR slashdotptr;
    LPSTR slashptr;

    /* step 1 : replace '//' sequences by a single '/' */

    slashslashptr = lpUnixPath;
    while(1)
    {
        slashslashptr = strstr(slashslashptr,"//");
        if(NULL == slashslashptr)
        {
            break;
        }
        /* remove extra '/' */
        TRACE("stripping '//' from %s\n", lpUnixPath);
        memmove(slashslashptr,slashslashptr+1,strlen(slashslashptr+1)+1);
    }

    /* step 2 : replace '/./' sequences by a single '/' */

    slashdotptr = lpUnixPath;
    while(1)
    {
        slashdotptr = strstr(slashdotptr,"/./");
        if(NULL == slashdotptr)
        {
            break;
        }
        /* strip the extra '/.' */
        TRACE("removing '/./' sequence from %s\n", lpUnixPath);
        memmove(slashdotptr,slashdotptr+2,strlen(slashdotptr+2)+1);
    }

    /* step 3 : replace '/<name>/../' sequences by a single '/' */

    while(1)
    {
        dotdotptr = strstr(lpUnixPath,"/../");
        if(NULL == dotdotptr)
        {
            break;
        }
        if(dotdotptr == lpUnixPath)
        {
            /* special case : '/../' at the beginning of the path are replaced
               by a single '/' */
            TRACE("stripping leading '/../' from %s\n", lpUnixPath);
            memmove(lpUnixPath, lpUnixPath+3,strlen(lpUnixPath+3)+1);
            continue;
        }

        /* null-terminate the string before the '/../', so that strrchr will
           start looking right before it */
        *dotdotptr = '\0';
        slashptr = strrchr(lpUnixPath,'/');
        if(NULL == slashptr)
        {
            /* this happens if this function was called with a relative path.
               don't do that.  */
            ASSERT("can't find leading '/' before '/../ sequence\n");
            break;
        }
        TRACE("removing '/<dir>/../' sequence from %s\n", lpUnixPath);
        memmove(slashptr,dotdotptr+3,strlen(dotdotptr+3)+1);
    }

    /* step 4 : remove a trailing '/..' */

    dotdotptr = strstr(lpUnixPath,"/..");
    if(dotdotptr == lpUnixPath)
    {
        /* if the full path is simply '/..', replace it by '/' */
        lpUnixPath[1] = '\0';
    }
    else if(NULL != dotdotptr && '\0' == dotdotptr[3])
    {
        *dotdotptr = '\0';
        slashptr = strrchr(lpUnixPath,'/');
        if(NULL != slashptr)
        {
            /* make sure the last slash isn't the root */
            if (slashptr == lpUnixPath)
            {
                lpUnixPath[1] = '\0';
            }
            else
            {
                *slashptr = '\0';
            }
        }
    }

    /* step 5 : remove a traling '/.' */

    slashdotptr = strstr(lpUnixPath,"/.");
    if (slashdotptr != NULL && slashdotptr[2] == '\0')
    {
        if(slashdotptr == lpUnixPath)
        {
            // if the full path is simply '/.', replace it by '/' */
            lpUnixPath[1] = '\0';
        }
        else
        {
            *slashdotptr = '\0';
        }
    }
}